

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiDockNode *
DockBuilderCopyNodeRec
          (ImGuiDockNode *src_node,ImGuiID dst_node_id_if_known,
          ImVector<unsigned_int> *out_node_remap_pairs)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  ImGuiDockNode *pIVar5;
  uint *puVar6;
  ImGuiDockNode *pIVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  
  pIVar5 = ImGui::DockContextAddNode(GImGui,dst_node_id_if_known);
  uVar2 = src_node->SharedFlags;
  pIVar5->SharedFlags = uVar2;
  uVar3 = src_node->LocalFlags;
  pIVar5->LocalFlags = uVar3;
  pIVar5->LocalFlagsInWindows = 0;
  pIVar5->Pos = src_node->Pos;
  pIVar5->Size = src_node->Size;
  pIVar5->SizeRef = src_node->SizeRef;
  pIVar5->SplitAxis = src_node->SplitAxis;
  pIVar5->MergedFlags = uVar3 | uVar2;
  iVar9 = out_node_remap_pairs->Capacity;
  if (out_node_remap_pairs->Size == iVar9) {
    iVar10 = out_node_remap_pairs->Size + 1;
    if (iVar9 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar9 / 2 + iVar9;
    }
    if (iVar10 < iVar8) {
      iVar10 = iVar8;
    }
    if (iVar9 < iVar10) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      puVar6 = (uint *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
      if (out_node_remap_pairs->Data != (uint *)0x0) {
        memcpy(puVar6,out_node_remap_pairs->Data,(long)out_node_remap_pairs->Size << 2);
        puVar4 = out_node_remap_pairs->Data;
        if ((puVar4 != (uint *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
      }
      out_node_remap_pairs->Data = puVar6;
      out_node_remap_pairs->Capacity = iVar10;
    }
  }
  out_node_remap_pairs->Data[out_node_remap_pairs->Size] = src_node->ID;
  iVar10 = out_node_remap_pairs->Size;
  iVar8 = out_node_remap_pairs->Capacity;
  iVar9 = iVar10 + 1;
  out_node_remap_pairs->Size = iVar9;
  if (iVar9 == iVar8) {
    iVar10 = iVar10 + 2;
    if (iVar8 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar8 / 2 + iVar8;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar8 < iVar10) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      puVar6 = (uint *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
      if (out_node_remap_pairs->Data != (uint *)0x0) {
        memcpy(puVar6,out_node_remap_pairs->Data,(long)out_node_remap_pairs->Size << 2);
        puVar4 = out_node_remap_pairs->Data;
        if ((puVar4 != (uint *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
      }
      out_node_remap_pairs->Data = puVar6;
      out_node_remap_pairs->Capacity = iVar10;
    }
  }
  out_node_remap_pairs->Data[out_node_remap_pairs->Size] = pIVar5->ID;
  out_node_remap_pairs->Size = out_node_remap_pairs->Size + 1;
  lVar11 = 4;
  do {
    if (src_node->ChildNodes[lVar11 + -4] != (ImGuiDockNode *)0x0) {
      pIVar7 = DockBuilderCopyNodeRec(src_node->ChildNodes[lVar11 + -4],0,out_node_remap_pairs);
      pIVar5->ChildNodes[lVar11 + -4] = pIVar7;
      pIVar7->ParentNode = pIVar5;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 == 5);
  return pIVar5;
}

Assistant:

static ImGuiDockNode* DockBuilderCopyNodeRec(ImGuiDockNode* src_node, ImGuiID dst_node_id_if_known, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* dst_node = ImGui::DockContextAddNode(ctx, dst_node_id_if_known);
    dst_node->SharedFlags = src_node->SharedFlags;
    dst_node->LocalFlags = src_node->LocalFlags;
    dst_node->LocalFlagsInWindows = ImGuiDockNodeFlags_None;
    dst_node->Pos = src_node->Pos;
    dst_node->Size = src_node->Size;
    dst_node->SizeRef = src_node->SizeRef;
    dst_node->SplitAxis = src_node->SplitAxis;
    dst_node->UpdateMergedFlags();

    out_node_remap_pairs->push_back(src_node->ID);
    out_node_remap_pairs->push_back(dst_node->ID);

    for (int child_n = 0; child_n < IM_ARRAYSIZE(src_node->ChildNodes); child_n++)
        if (src_node->ChildNodes[child_n])
        {
            dst_node->ChildNodes[child_n] = DockBuilderCopyNodeRec(src_node->ChildNodes[child_n], 0, out_node_remap_pairs);
            dst_node->ChildNodes[child_n]->ParentNode = dst_node;
        }

    IMGUI_DEBUG_LOG_DOCKING("Fork node %08X -> %08X (%d childs)\n", src_node->ID, dst_node->ID, dst_node->IsSplitNode() ? 2 : 0);
    return dst_node;
}